

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::ProcessStatsConfig
          (ProcessStatsConfig *this,ProcessStatsConfig *param_1)

{
  pointer pPVar1;
  bool bVar2;
  undefined2 uVar3;
  uint32_t uVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessStatsConfig_004075d8;
  pPVar1 = (param_1->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->quirks_).
       super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  (this->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->quirks_).
       super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->proc_stats_cache_ttl_ms_ = param_1->proc_stats_cache_ttl_ms_;
  bVar2 = param_1->record_thread_names_;
  uVar3 = *(undefined2 *)&param_1->field_0x22;
  uVar4 = param_1->proc_stats_poll_ms_;
  this->scan_all_processes_on_start_ = param_1->scan_all_processes_on_start_;
  this->record_thread_names_ = bVar2;
  *(undefined2 *)&this->field_0x22 = uVar3;
  this->proc_stats_poll_ms_ = uVar4;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ProcessStatsConfig::ProcessStatsConfig(ProcessStatsConfig&&) noexcept = default;